

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O1

void skiwi::compile_remainder(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t lab_01;
  string error;
  string division_by_zero;
  string l2;
  string l1;
  operand local_dc [3];
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  psVar1 = label;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  label = label + 1;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  label_to_string_abi_cxx11_(&local_50,psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_70,psVar1,lab);
  psVar1 = label;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_d0,psVar1,lab_00);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
    lab_01 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      lab_01 = extraout_RDX_00;
    }
    psVar1 = label;
    label = label + 1;
    label_to_string_abi_cxx11_(&local_d0,psVar1,lab_01);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    local_d0._M_dataplus._M_p._0_4_ = 5;
    local_dc[0] = R11;
    local_dc[1] = 0x39;
    local_dc[2] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_d0,local_dc,local_dc + 1,(int *)(local_dc + 2));
    local_d0._M_dataplus._M_p._0_4_ = 0x30;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_d0,&local_b0);
  }
  jump_short_if_arg_is_not_block(code,RCX,R11,&local_50);
  local_dc[0] = AH;
  local_dc[1] = 0xb;
  local_dc[2] = 0x39;
  local_d0._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_dc,local_dc + 1,local_dc + 2,(unsigned_long *)&local_d0);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_flonum(code,RCX,R11,&local_b0);
  }
  local_d0._M_dataplus._M_p._0_4_ = 0x43;
  local_dc[0] = XMM0;
  local_dc[1] = 0x1b;
  local_dc[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d0,local_dc,local_dc + 1,(int *)(local_dc + 2));
  local_d0._M_dataplus._M_p._0_4_ = 0xc;
  local_dc[0] = RCX;
  local_dc[1] = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d0,local_dc,local_dc + 1);
  local_d0._M_dataplus._M_p._0_4_ = 0x55;
  local_dc[0] = RCX;
  local_dc[1] = 0x39;
  local_dc[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d0,local_dc,local_dc + 1,(int *)(local_dc + 2));
  local_d0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_d0,&local_50);
  jump_short_if_arg_is_not_block(code,RDX,R11,&local_70);
  local_dc[0] = AH;
  local_dc[1] = 0xc;
  local_dc[2] = 0x39;
  local_d0._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_dc,local_dc + 1,local_dc + 2,(unsigned_long *)&local_d0);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_flonum(code,RDX,R11,&local_b0);
  }
  local_d0._M_dataplus._M_p._0_4_ = 0x43;
  local_dc[0] = XMM0;
  local_dc[1] = 0x1c;
  local_dc[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d0,local_dc,local_dc + 1,(int *)(local_dc + 2));
  local_d0._M_dataplus._M_p._0_4_ = 0xc;
  local_dc[0] = RDX;
  local_dc[1] = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d0,local_dc,local_dc + 1);
  local_d0._M_dataplus._M_p._0_4_ = 0x55;
  local_dc[0] = RDX;
  local_dc[1] = 0x39;
  local_dc[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_d0,local_dc,local_dc + 1,(int *)(local_dc + 2));
  local_d0._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_d0,&local_70);
  if (ops->safe_primitives == true) {
    local_d0._M_dataplus._M_p._0_4_ = 0x5a;
    local_dc[0] = RCX;
    local_dc[1] = 0x39;
    local_dc[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_d0,local_dc,local_dc + 1,(int *)(local_dc + 2));
    local_d0._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_d0,&local_b0);
    local_d0._M_dataplus._M_p._0_4_ = 0x5a;
    local_dc[0] = RDX;
    local_dc[1] = 0x39;
    local_dc[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_d0,local_dc,local_dc + 1,(int *)(local_dc + 2));
    local_d0._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_d0,&local_b0);
    local_d0._M_dataplus._M_p._0_4_ = 0x5a;
    local_dc[0] = RDX;
    local_dc[1] = 0xc;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,(operation *)&local_d0,local_dc,local_dc + 1);
    local_d0._M_dataplus._M_p._0_4_ = 0x38;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_d0,&local_90);
  }
  local_d0._M_dataplus._M_p._0_4_ = 0x40;
  local_dc[0] = RAX;
  local_dc[1] = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d0,local_dc,local_dc + 1);
  local_d0._M_dataplus._M_p._0_4_ = 0x40;
  local_dc[0] = RCX;
  local_dc[1] = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d0,local_dc,local_dc + 1);
  local_d0._M_dataplus._M_p._0_4_ = 0x5c;
  local_dc[0] = RDX;
  local_dc[1] = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d0,local_dc,local_dc + 1);
  local_d0._M_dataplus._M_p._0_4_ = 10;
  assembler::asmcode::add<assembler::asmcode::operation>(code,(operation *)&local_d0);
  local_d0._M_dataplus._M_p._0_4_ = 0x29;
  local_dc[0] = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_d0,local_dc);
  local_d0._M_dataplus._M_p._0_4_ = 0x40;
  local_dc[0] = RAX;
  local_dc[1] = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_d0,local_dc,local_dc + 1);
  local_dc[0] = AH;
  local_dc[1] = 9;
  local_dc[2] = 0x39;
  local_d0._M_dataplus._M_p = (pointer)0xfffffffffffffffe;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_dc,local_dc + 1,local_dc + 2,(unsigned_long *)&local_d0);
  local_d0._M_dataplus._M_p._0_4_ = 0x2c;
  local_dc[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_d0,local_dc);
  if (ops->safe_primitives == true) {
    error_label(code,&local_b0,re_remainder_contract_violation);
    error_label(code,&local_90,re_division_by_zero);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void compile_remainder(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string division_by_zero;
  std::string l1 = label_to_string(label++);
  std::string l2 = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    division_by_zero = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JL, error);
    }
  jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, l1);
  //rcx is a block
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::MEM_RCX, CELLS(1));
  code.add(asmcode::CVTTSD2SI, asmcode::RCX, asmcode::XMM0);
  code.add(asmcode::SHL, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::LABEL, l1);

  jump_short_if_arg_is_not_block(code, asmcode::RDX, asmcode::R11, l2);
  //rdx is a block
  code.add(asmcode::AND, asmcode::RDX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RDX, asmcode::R11, error);
    }
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::MEM_RDX, CELLS(1));
  code.add(asmcode::CVTTSD2SI, asmcode::RDX, asmcode::XMM0);
  code.add(asmcode::SHL, asmcode::RDX, asmcode::NUMBER, 1);
  code.add(asmcode::LABEL, l2);

  if (ops.safe_primitives)
    {
    code.add(asmcode::TEST, asmcode::RCX, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::RDX);
    code.add(asmcode::JES, division_by_zero);
    }
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RCX, asmcode::RDX);
  code.add(asmcode::XOR, asmcode::RDX, asmcode::RDX);
  code.add(asmcode::CQO);
  code.add(asmcode::IDIV, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RDX);
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, ~((uint64_t)1));
  code.add(asmcode::JMP, CONTINUE);

  if (ops.safe_primitives)
    {
    error_label(code, error, re_remainder_contract_violation);
    error_label(code, division_by_zero, re_division_by_zero);
    }
  }